

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O2

MkTimeResult *
anon_unknown.dwarf_3bced0::resolveLocalTime
          (MkTimeResult *__return_storage_ptr__,qint64 local,TransitionOptions resolve)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  time_t tVar5;
  time_t tVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  qint64 qVar10;
  qint64 qVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  undefined8 *puVar15;
  tm *ptVar16;
  MkTimeResult *pMVar17;
  undefined1 *puVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  long in_FS_OFFSET;
  byte bVar22;
  R_conflict3 RVar23;
  YearMonthDay YVar24;
  tm local_210;
  tm local_1d8;
  tm local_1a0;
  undefined1 local_168 [8];
  undefined1 *puStack_160;
  undefined1 *local_158;
  undefined1 *puStack_150;
  int local_148;
  int iStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined1 *puStack_130;
  undefined8 local_128;
  MkTimeResult later;
  tm local_d0;
  time_t local_98;
  undefined1 local_8f;
  MkTimeResult result;
  
  bVar22 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  RVar23 = QRoundingDown::qDivMod<86400U,_long_long,_true>(local);
  YVar24 = QGregorianCalendar::partsFromJulian(RVar23.quotient + 0x253d8c);
  local_210.tm_mday = YVar24.day;
  local_210.tm_wday = 0;
  local_210.tm_yday = 0;
  local_210.tm_gmtoff = 0;
  local_210.tm_zone = (char *)0x0;
  local_210.tm_year = (YVar24.year - (YVar24.year >> 0x1f)) + -0x76c;
  local_210.tm_mon = YVar24.month + -1;
  uVar13 = (int)RVar23.remainder >> 0x1f;
  uVar3 = (ulong)uVar13 << 0x20 | RVar23.remainder & 0xffffffffU;
  local_210.tm_hour = (int)((long)uVar3 / 0xe10);
  local_210.tm_min = (int)(short)((short)((long)uVar3 % 0xe10) / 0x3c);
  local_210.tm_sec = (int)((long)((ulong)uVar13 << 0x20 | RVar23.remainder & 0xffffffffU) % 0x3c);
  local_210.tm_isdst = -1;
  local_210._36_4_ = 0;
  local_128 = &DAT_aaaaaaaaaaaaaaaa;
  local_138 = 0xaaaaaaaa;
  uStack_134 = 0xaaaaaaaa;
  puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
  local_148 = -0x55555556;
  iStack_144 = -0x55555556;
  uStack_140 = 0xaaaaaaaa;
  uStack_13c = 0xaaaaaaaa;
  local_158 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
  local_168 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  puStack_160 = &DAT_aaaaaaaaaaaaaaaa;
  MkTimeResult::MkTimeResult((MkTimeResult *)local_168,&local_210);
  iVar20 = local_210.tm_year;
  iVar21 = local_210.tm_mon;
  iVar4 = local_210.tm_mday;
  later.local.tm_mon = local_210.tm_mon;
  if (local_128._0_1_ == false) {
    local_1d8.tm_zone = local_210.tm_zone;
    local_1d8.tm_min = local_210.tm_min;
    local_1d8.tm_sec = local_210.tm_sec;
    local_1d8.tm_mday = local_210.tm_mday;
    local_1d8.tm_hour = local_210.tm_hour;
    local_1d8.tm_year = local_210.tm_year;
    local_1d8.tm_mon = local_210.tm_mon;
    local_1d8.tm_isdst = local_210.tm_isdst;
    local_1d8._36_4_ = local_210._36_4_;
    local_1d8.tm_gmtoff = local_210.tm_gmtoff;
    local_1d8.tm_wday = local_210.tm_wday;
    local_1d8.tm_yday = local_210.tm_yday;
    puVar15 = (undefined8 *)local_168;
    ptVar16 = &local_d0;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      uVar1 = *puVar15;
      ptVar16->tm_sec = (int)uVar1;
      ptVar16->tm_min = (int)((ulong)uVar1 >> 0x20);
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      ptVar16 = (tm *)((long)ptVar16 + ((ulong)bVar22 * -2 + 1) * 8);
    }
    if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
               super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 6) != 0) {
      result._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      result.local.tm_zone = &DAT_aaaaaaaaaaaaaaaa;
      result.utcSecs = (time_t)&DAT_aaaaaaaaaaaaaaaa;
      result.local._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      result.local.tm_gmtoff = (long)&DAT_aaaaaaaaaaaaaaaa;
      result.local.tm_mon = -0x55555556;
      result.local.tm_year = -0x55555556;
      result.local._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      result.local.tm_sec = -0x55555556;
      result.local.tm_min = -0x55555556;
      result.local.tm_hour = -0x55555556;
      result.local.tm_mday = -0x55555556;
      iVar19 = local_210.tm_mday + -1;
      iVar14 = local_210.tm_year;
      if (local_210.tm_mday < 2) {
        if (local_210.tm_mon == 0) {
          iVar14 = local_210.tm_year + -1;
          iVar9 = QGregorianCalendar::monthLength
                            (0xc,(local_210.tm_year - (uint)(local_210.tm_year < -0x76a)) + 0x76b);
          later.local.tm_mon = 0xb;
        }
        else {
          iVar9 = QGregorianCalendar::monthLength
                            (local_210.tm_mon,
                             (local_210.tm_year - (uint)(local_210.tm_year < -0x76b)) + 0x76c);
          later.local.tm_mon = 0xb;
          if (0 < iVar21) {
            later.local.tm_mon = iVar21 + -1;
          }
          iVar14 = iVar20 - (uint)(iVar21 < 1);
        }
        iVar19 = iVar19 + iVar9;
      }
      later.local.tm_min = local_210.tm_min;
      later.local.tm_sec = local_210.tm_sec;
      later.local.tm_mday = iVar19;
      later.local.tm_hour = local_210.tm_hour;
      later.local.tm_year = iVar14;
      later.local.tm_wday = local_210.tm_wday;
      later.local.tm_yday = local_210.tm_yday;
      later.local.tm_isdst = local_210.tm_isdst;
      later.local._36_4_ = local_210._36_4_;
      later.local.tm_gmtoff = local_210.tm_gmtoff;
      later.local.tm_zone = local_210.tm_zone;
      MkTimeResult::MkTimeResult(&result,&later.local);
      later._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      later.local.tm_zone = &DAT_aaaaaaaaaaaaaaaa;
      later.utcSecs = (time_t)&DAT_aaaaaaaaaaaaaaaa;
      later.local._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      later.local.tm_gmtoff = (long)&DAT_aaaaaaaaaaaaaaaa;
      later.local._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      later.local._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      later.local._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      later.local._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_1a0.tm_mday = iVar4 + 1;
      if (0x1b < iVar4) {
        iVar19 = QGregorianCalendar::monthLength
                           (iVar21 + 1,(iVar20 - (uint)(iVar20 < -0x76b)) + 0x76c);
        if (iVar19 <= iVar4) {
          local_1a0.tm_mday = local_1a0.tm_mday - iVar19;
          bVar7 = 10 < iVar21;
          bVar8 = 10 < iVar21;
          iVar21 = iVar21 + 1;
          if (bVar8) {
            iVar21 = 0;
          }
          iVar20 = iVar20 + (uint)bVar7;
        }
      }
      local_1a0.tm_hour = local_210.tm_hour;
      local_1a0.tm_min = local_210.tm_min;
      local_1a0.tm_sec = local_210.tm_sec;
      local_1a0.tm_wday = local_210.tm_wday;
      local_1a0.tm_yday = local_210.tm_yday;
      local_1a0.tm_isdst = local_210.tm_isdst;
      local_1a0._36_4_ = local_210._36_4_;
      local_1a0.tm_gmtoff = local_210.tm_gmtoff;
      local_1a0.tm_zone = local_210.tm_zone;
      local_1a0.tm_mon = iVar21;
      local_1a0.tm_year = iVar20;
      MkTimeResult::MkTimeResult(&later,&local_1a0);
      tVar6 = result.utcSecs;
      tVar5 = later.utcSecs;
      if ((result.good == true) && (later.good != false)) {
        local_8f = 1;
        if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                   super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i >> 10 & 1) == 0) {
          uVar13 = 2;
        }
        else {
          uVar13 = (uint)(result.local.tm_isdst == 1 && later.local.tm_isdst == 0) * 2 + 2;
        }
        if ((uVar13 & (uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>
                            .super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) == 0) {
          qVar10 = secondsBetween(&result.local,&local_1d8);
          local_98 = qVar10 + tVar6;
        }
        else {
          qVar10 = secondsBetween(&local_1d8,&later.local);
          local_98 = tVar5 - qVar10;
        }
        bVar7 = qLocalTime(local_98,&local_d0);
        if (bVar7) {
          ptVar16 = &local_d0;
          goto LAB_001231c7;
        }
      }
    }
LAB_0012355b:
    (__return_storage_ptr__->local).tm_mon = 0;
    (__return_storage_ptr__->local).tm_year = 0;
    (__return_storage_ptr__->local).tm_wday = 0;
    (__return_storage_ptr__->local).tm_yday = 0;
    (__return_storage_ptr__->local).tm_sec = 0;
    (__return_storage_ptr__->local).tm_min = 0;
    (__return_storage_ptr__->local).tm_hour = 0;
    (__return_storage_ptr__->local).tm_mday = 0;
    (__return_storage_ptr__->local).tm_gmtoff = 0;
    (__return_storage_ptr__->local).tm_zone = (char *)0x0;
    __return_storage_ptr__->utcSecs = -1;
    __return_storage_ptr__->good = false;
    __return_storage_ptr__->adjusted = true;
    (__return_storage_ptr__->local).tm_isdst = -1;
  }
  else {
    if (-1 < local_148) {
      if (local_128._1_1_ == true) {
        if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                   super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 6) == 0) {
          local_168._0_4_ = 0;
          local_168._4_4_ = 0;
          puStack_160 = (undefined1 *)0x0;
          local_158 = (undefined1 *)0x0;
          puStack_150 = (undefined1 *)0x0;
          local_148 = -1;
          result.local.tm_min = 0;
          result.local.tm_hour = 0;
          result.local.tm_mday = 0;
          result.local.tm_mon = 0;
          iStack_144 = result.local.tm_sec;
          uStack_140 = 0;
          uStack_13c = 0;
          local_138 = 0;
LAB_00123024:
          local_138 = 0;
          uStack_13c = 0;
          uStack_140 = 0;
          local_148 = -1;
          puStack_150 = (undefined1 *)0x0;
          local_158 = (undefined1 *)0x0;
          puStack_160 = (undefined1 *)0x0;
          local_168 = (undefined1  [8])0x0;
          ptVar16 = (tm *)local_168;
          uStack_134 = 0;
          puStack_130 = (undefined1 *)0xffffffffffffffff;
          local_128 = (undefined1 *)CONCAT62(local_128._2_6_,0x100);
          goto LAB_001231c7;
        }
        result._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
        result.local.tm_zone = &DAT_aaaaaaaaaaaaaaaa;
        result.utcSecs = (time_t)&DAT_aaaaaaaaaaaaaaaa;
        result.local._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        result.local.tm_gmtoff = (long)&DAT_aaaaaaaaaaaaaaaa;
        qVar10 = secondsBetween((tm *)local_168,&local_210);
        later.local.tm_zone = &DAT_aaaaaaaaaaaaaaaa;
        later.local._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        later.local.tm_gmtoff = (long)&DAT_aaaaaaaaaaaaaaaa;
        later.local._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        later.local._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        later.local._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        later.local._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        bVar7 = qLocalTime((time_t)(puStack_130 + qVar10),&later.local);
        if (bVar7) {
          qVar11 = secondsBetween((tm *)local_168,&later.local);
          if (qVar10 < 1) {
            if (qVar11 < qVar10) goto LAB_0012349d;
            goto LAB_001234ec;
          }
          if (qVar11 <= qVar10) goto LAB_001234ec;
LAB_0012349d:
          result._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
          result.local.tm_zone = &DAT_aaaaaaaaaaaaaaaa;
          result.utcSecs = (time_t)&DAT_aaaaaaaaaaaaaaaa;
          result.local._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          result.local.tm_gmtoff = (long)&DAT_aaaaaaaaaaaaaaaa;
          result.local.tm_mon = -0x55555556;
          result.local.tm_year = -0x55555556;
          result.local._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          result.local.tm_sec = -0x55555556;
          result.local.tm_min = -0x55555556;
          result.local.tm_hour = -0x55555556;
          result.local.tm_mday = -0x55555556;
          MkTimeResult::MkTimeResult(&result,&later.local);
          if ((result.good != true) || (result.adjusted != false)) goto LAB_001234ec;
          bVar7 = false;
          iVar21 = result.local.tm_isdst;
        }
        else {
LAB_001234ec:
          result.local.tm_mon = 0;
          result.local.tm_year = 0;
          result.local.tm_wday = 0;
          result.local.tm_yday = 0;
          result.local.tm_sec = 0;
          result.local.tm_min = 0;
          result.local.tm_hour = 0;
          result.local.tm_mday = 0;
          result.local.tm_gmtoff = 0;
          result.local.tm_zone = (char *)0x0;
          result.utcSecs = -1;
          result.good = false;
          result.adjusted = true;
          result.local.tm_isdst = -1;
          bVar7 = true;
          iVar21 = -1;
        }
        bVar8 = preferAlternative(resolve,local_148,iVar21,(long)puStack_130 < result.utcSecs,true);
        if (bVar8) {
          if (bVar7) goto LAB_0012355b;
          pMVar17 = &result;
          puVar18 = local_168;
          for (lVar12 = 0x42; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar18 = (char)(pMVar17->local).tm_sec;
            pMVar17 = (MkTimeResult *)((long)pMVar17 + (ulong)bVar22 * -2 + 1);
            puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
          }
          local_128._0_2_ = CONCAT11(true,local_128._0_1_);
        }
      }
      else if ((((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                       super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i >> 10 & 1) == 0) ||
              (((uint)(local_148 != 0) * 0x20 - 0x441 |
               (uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                     super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i) != 0xffffffff)) {
        later.local.tm_min = local_210.tm_min;
        later.local.tm_sec = local_210.tm_sec;
        later.local.tm_mday = local_210.tm_mday;
        later.local.tm_hour = local_210.tm_hour;
        later.local.tm_year = local_210.tm_year;
        later.local.tm_gmtoff = local_210.tm_gmtoff;
        later.local.tm_zone = local_210.tm_zone;
        later.local.tm_wday = local_210.tm_wday;
        later.local.tm_yday = local_210.tm_yday;
        later.local._36_4_ = local_210._36_4_;
        later.local.tm_isdst = (uint)(local_148 == 0);
        result._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
        result.local.tm_zone = &DAT_aaaaaaaaaaaaaaaa;
        result.utcSecs = (time_t)&DAT_aaaaaaaaaaaaaaaa;
        result.local._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        result.local.tm_gmtoff = (long)&DAT_aaaaaaaaaaaaaaaa;
        result.local.tm_mon = -0x55555556;
        result.local.tm_year = -0x55555556;
        result.local._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        result.local.tm_sec = -0x55555556;
        result.local.tm_min = -0x55555556;
        result.local.tm_hour = -0x55555556;
        result.local.tm_mday = -0x55555556;
        MkTimeResult::MkTimeResult(&result,&later.local);
        if ((result.good == true) && (result.adjusted == false)) {
          if (((uint)resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                     super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i & 0x60) == 0) {
            local_168._0_4_ = 0;
            local_168._4_4_ = 0;
            puStack_160 = (undefined1 *)0x0;
            local_158 = (undefined1 *)0x0;
            puStack_150 = (undefined1 *)0x0;
            local_148 = -1;
            local_d0.tm_min = 0;
            local_d0.tm_hour = 0;
            local_d0.tm_mday = 0;
            local_d0.tm_mon = 0;
            iStack_144 = local_d0.tm_sec;
            uStack_140 = 0;
            uStack_13c = 0;
            local_138 = 0;
            goto LAB_00123024;
          }
          bVar7 = preferAlternative(resolve,local_148,result.local.tm_isdst,
                                    (long)puStack_130 < result.utcSecs,false);
          if (bVar7) {
            pMVar17 = &result;
            puVar18 = local_168;
            for (lVar12 = 0x42; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar18 = (char)(pMVar17->local).tm_sec;
              pMVar17 = (MkTimeResult *)((long)pMVar17 + (ulong)bVar22 * -2 + 1);
              puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
            }
          }
        }
      }
    }
    ptVar16 = (tm *)local_168;
LAB_001231c7:
    pMVar17 = __return_storage_ptr__;
    for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
      iVar21 = ptVar16->tm_min;
      (pMVar17->local).tm_sec = ptVar16->tm_sec;
      (pMVar17->local).tm_min = iVar21;
      ptVar16 = (tm *)((long)ptVar16 + ((ulong)bVar22 * -2 + 1) * 8);
      pMVar17 = (MkTimeResult *)((long)pMVar17 + (ulong)bVar22 * -0x10 + 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

MkTimeResult resolveLocalTime(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    const auto localDaySecs = QRoundingDown::qDivMod<SECS_PER_DAY>(local);
    struct tm base = timeToTm(localDaySecs.quotient, localDaySecs.remainder);

    // Get provisional result (correct > 99.9 % of the time):
    MkTimeResult result(base);

    // Our callers (mostly) deal with questions of being within the range that
    // system time_t functions can handle, and timeToTm() gave us data in
    // normalized form, so the only excuse for !good or a change to the HH:mm:ss
    // fields (aside from being at the boundary of time_t's supported range) is
    // that we hit a gap, although we have to handle these cases differently:
    if (!result.good) {
        // Rejected. The tricky case: maybe mktime() doesn't resolve gaps.
        return resolveRejected(base, result, resolve);
    } else if (result.local.tm_isdst < 0) {
        // Apparently success without knowledge of whether this is DST or not.
        // Should not happen, but that means our usual understanding of what the
        // system is up to has gone out the window. So just let it be.
    } else if (result.adjusted) {
        // Shunted out of a gap.
        if (!resolve.testAnyFlags(QDateTimePrivate::GapMask)) {
            result = {};
            return result;
        }

        // Try to obtain a matching point on the other side of the gap:
        const MkTimeResult flipped = hopAcrossGap(result, base);
        // Even if that failed, result may be the correct resolution

        if (preferAlternative(resolve, result.local.tm_isdst, flipped.local.tm_isdst,
                              flipped.utcSecs > result.utcSecs, true)) {
            // If hopAcrossGap() failed and we do need its answer, give up.
            if (!flipped.good || flipped.adjusted)
                return {};

            // As resolution of local, flipped involves adjustment (across gap):
            result = flipped;
            result.adjusted = true;
        }
    } else if (resolve.testFlag(QDateTimePrivate::FlipForReverseDst)
               // In fold, DST counts as before and standard as after -
               // we may not need to check whether we're in a transition:
               && resolve.testFlag(result.local.tm_isdst ? QDateTimePrivate::FoldUseBefore
                                                         : QDateTimePrivate::FoldUseAfter)) {
        // We prefer DST or standard and got what we wanted, so we're good.
        // As below, but we don't need to check, because we're on the side of
        // the transition that it would select as valid, if we were near one.
        // NB: this branch is routinely exercised, when QDT::Data::isShort()
        // obliges us to rediscover an offsetFromUtc that ShortData has no space
        // to store, as it does remember the DST status we got before.
    } else {
        // What we gave was valid. However, it might have been in a fall-back.
        // If so, the same input but with tm_isdst flipped should also be valid.
        struct tm copy = base;
        copy.tm_isdst = !result.local.tm_isdst;
        const MkTimeResult flipped(copy);
        if (flipped.good && !flipped.adjusted) {
            // We're in a fall-back
            if (!resolve.testAnyFlags(QDateTimePrivate::FoldMask)) {
                result = {};
                return result;
            }

            // Work out which repeat to use:
            if (preferAlternative(resolve, result.local.tm_isdst, flipped.local.tm_isdst,
                                  flipped.utcSecs > result.utcSecs, false)) {
                result = flipped;
            }
        } // else: not in a transition, nothing to worry about.
    }
    return result;
}